

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O0

void __thiscall JetHead::vector<URI::QueryParam>::~vector(vector<URI::QueryParam> *this)

{
  vector<URI::QueryParam> *this_local;
  
  if (this->mData != (QueryParam *)0x0) {
    clear(this);
    if (this->mData != (QueryParam *)0x0) {
      operator_delete__(this->mData);
    }
    this->mData = (QueryParam *)0x0;
  }
  return;
}

Assistant:

~vector()
		{
			if (mData)
			{
				// Call all of our destructors for contained objects
				clear();
				
				// Free memory
				delete[] (uint8_t*)mData;
				mData = NULL;
			}
		}